

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

ulong __thiscall
testing::internal::FunctionMockerBase<TestColumnSizeHandler_()>::PerformDefaultAction
          (FunctionMockerBase<TestColumnSizeHandler_()> *this,ArgumentTuple *args,
          string *call_description)

{
  uint uVar1;
  pointer pcVar2;
  OnCallSpec<TestColumnSizeHandler_()> *this_00;
  Action<TestColumnSizeHandler_()> *this_01;
  ulong uVar3;
  runtime_error *this_02;
  string message;
  long *local_38 [2];
  long local_28 [2];
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<TestColumnSizeHandler_()> *)0x0) {
    this_01 = OnCallSpec<TestColumnSizeHandler_()>::GetAction(this_00);
    uVar3 = Action<TestColumnSizeHandler_()>::Perform(this_01,args);
    return uVar3;
  }
  pcVar2 = (call_description->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar2,pcVar2 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)local_38);
  if (DefaultValue<TestColumnSizeHandler>::value_ != (uint *)0x0) {
    uVar1 = *DefaultValue<TestColumnSizeHandler>::value_;
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    return (ulong)uVar1;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,(string *)local_38);
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }